

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_utils.c
# Opt level: O2

uint16_t av1_setup_interp_filter_search_mask(AV1_COMP *cpi)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  AV1_COMMON *cm;
  InterpFilter ifilter;
  InterpFilter IVar8;
  MV_REFERENCE_FRAME ref;
  int iVar9;
  long lVar10;
  int iVar11;
  uint uVar12;
  uint local_68;
  int ref_total [8];
  
  ref_total[4] = 0;
  ref_total[5] = 0;
  ref_total[6] = 0;
  ref_total[7] = 0;
  ref_total[0] = 0;
  ref_total[1] = 0;
  ref_total[2] = 0;
  ref_total[3] = 0;
  local_68._0_2_ = 0x1ff;
  if ((cpi->last_frame_type != '\0') && ((cpi->refresh_frame).alt_ref_frame == false)) {
    cm = &cpi->common;
    for (lVar10 = 1; lVar10 != 8; lVar10 = lVar10 + 1) {
      iVar11 = ref_total[lVar10];
      for (IVar8 = EIGHTTAP_REGULAR; IVar8 != BILINEAR; IVar8 = IVar8 + EIGHTTAP_SMOOTH) {
        iVar1 = get_interp_filter_selected(cm,(MV_REFERENCE_FRAME)lVar10,IVar8);
        iVar11 = iVar11 + iVar1;
      }
      ref_total[lVar10] = iVar11;
    }
    iVar11 = ref_total[1];
    iVar1 = ref_total[3] + ref_total[2] + ref_total[4] + ref_total[5] + ref_total[6] + ref_total[7];
    local_68 = 0x1ff;
    uVar12 = 0;
    for (iVar9 = 0; iVar9 != 3; iVar9 = iVar9 + 1) {
      IVar8 = (InterpFilter)iVar9;
      iVar2 = get_interp_filter_selected(cm,'\x01',IVar8);
      if ((iVar11 != 0) && (iVar2 * 0x1e <= iVar11)) {
        iVar2 = get_interp_filter_selected(cm,'\x02',IVar8);
        iVar3 = get_interp_filter_selected(cm,'\x03',IVar8);
        iVar4 = get_interp_filter_selected(cm,'\x04',IVar8);
        iVar5 = get_interp_filter_selected(cm,'\x05',IVar8);
        iVar6 = get_interp_filter_selected(cm,'\x06',IVar8);
        iVar7 = get_interp_filter_selected(cm,'\a',IVar8);
        if ((iVar6 + iVar5 + iVar7) * 10 + (iVar4 + iVar3 + iVar2) * 0x14 < iVar1) {
          local_68 = local_68 & (1 << (uVar12 & 0x1f) ^ 0x1ffU);
        }
      }
      uVar12 = uVar12 + 4;
    }
  }
  return (uint16_t)local_68;
}

Assistant:

uint16_t av1_setup_interp_filter_search_mask(AV1_COMP *cpi) {
  const AV1_COMMON *const cm = &cpi->common;
  int ref_total[REF_FRAMES] = { 0 };
  uint16_t mask = ALLOW_ALL_INTERP_FILT_MASK;

  if (cpi->last_frame_type == KEY_FRAME || cpi->refresh_frame.alt_ref_frame)
    return mask;

  for (MV_REFERENCE_FRAME ref = LAST_FRAME; ref <= ALTREF_FRAME; ++ref) {
    for (InterpFilter ifilter = EIGHTTAP_REGULAR; ifilter <= MULTITAP_SHARP;
         ++ifilter) {
      ref_total[ref] += get_interp_filter_selected(cm, ref, ifilter);
    }
  }
  int ref_total_total = (ref_total[LAST2_FRAME] + ref_total[LAST3_FRAME] +
                         ref_total[GOLDEN_FRAME] + ref_total[BWDREF_FRAME] +
                         ref_total[ALTREF2_FRAME] + ref_total[ALTREF_FRAME]);

  for (InterpFilter ifilter = EIGHTTAP_REGULAR; ifilter <= MULTITAP_SHARP;
       ++ifilter) {
    int last_score = get_interp_filter_selected(cm, LAST_FRAME, ifilter) * 30;
    if (ref_total[LAST_FRAME] && last_score <= ref_total[LAST_FRAME]) {
      int filter_score =
          get_interp_filter_selected(cm, LAST2_FRAME, ifilter) * 20 +
          get_interp_filter_selected(cm, LAST3_FRAME, ifilter) * 20 +
          get_interp_filter_selected(cm, GOLDEN_FRAME, ifilter) * 20 +
          get_interp_filter_selected(cm, BWDREF_FRAME, ifilter) * 10 +
          get_interp_filter_selected(cm, ALTREF2_FRAME, ifilter) * 10 +
          get_interp_filter_selected(cm, ALTREF_FRAME, ifilter) * 10;
      if (filter_score < ref_total_total) {
        DUAL_FILTER_TYPE filt_type = ifilter + SWITCHABLE_FILTERS * ifilter;
        reset_interp_filter_allowed_mask(&mask, filt_type);
      }
    }
  }
  return mask;
}